

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  undefined1 *puVar1;
  curl_off_t *pcVar2;
  char cVar3;
  Curl_easy *data;
  ulong uVar4;
  http_connect_state *phVar5;
  uint uVar6;
  _Bool _Var7;
  CURLcode CVar8;
  CURLcode CVar9;
  int iVar10;
  CHUNKcode CVar11;
  http_connect_state *phVar12;
  char *pcVar13;
  timediff_t tVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  size_t size;
  long lVar18;
  CURLcode CVar19;
  char *pcVar20;
  char *pcVar21;
  bool bVar22;
  Curl_send_buffer *req_buffer;
  undefined8 local_98;
  int *local_90;
  int local_84;
  http_connect_state *local_80;
  uint local_74;
  curl_off_t *local_70;
  curl_socket_t local_68;
  int subversion;
  long local_60;
  char *local_58;
  char *local_50;
  curl_off_t *local_48;
  int *local_40;
  ssize_t local_38;
  
  local_84 = sockindex;
  local_58 = hostname;
  if (conn->connect_state == (http_connect_state *)0x0) {
    phVar12 = (http_connect_state *)(*Curl_ccalloc)(1,0x4028);
    if (phVar12 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = phVar12;
    phVar12->tunnel_state = TUNNEL_INIT;
    phVar12->keepon = 1;
    phVar12->line_start = (char *)phVar12;
    phVar12->ptr = (char *)phVar12;
    phVar12->cl = 0;
    phVar12->field_0x4024 = phVar12->field_0x4024 & 0xfd;
  }
  subversion = 0;
  phVar12 = conn->connect_state;
  CVar9 = CURLE_OK;
  local_74 = remote_port;
  if ((phVar12 != (http_connect_state *)0x0) && (phVar12->tunnel_state != TUNNEL_COMPLETE)) {
    data = conn->data;
    local_60 = (long)local_84;
    local_68 = conn->sock[local_60];
    puVar1 = &(conn->bits).field_0x6;
    *puVar1 = *puVar1 & 0x7f;
    local_48 = &(data->info).request_size;
    local_40 = &phVar12->perline;
    local_90 = &(data->req).httpcode;
    local_70 = &phVar12->cl;
    local_80 = phVar12;
    CVar19 = CURLE_OK;
    do {
      pcVar16 = local_58;
      uVar6 = local_74;
      if (phVar12->tunnel_state == TUNNEL_INIT) {
        Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d\n",local_58,(ulong)local_74);
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        req_buffer = Curl_add_buffer_init();
        CVar9 = CURLE_OUT_OF_MEMORY;
        if (req_buffer == (Curl_send_buffer *)0x0) {
LAB_00138666:
          bVar22 = false;
          phVar12 = local_80;
        }
        else {
          pcVar16 = curl_maprintf("%s:%d",pcVar16,(ulong)uVar6);
          if (pcVar16 == (char *)0x0) {
            Curl_add_buffer_free(&req_buffer);
            goto LAB_00138666;
          }
          CVar8 = Curl_http_output_auth(conn,"CONNECT",pcVar16,true);
          (*Curl_cfree)(pcVar16);
          pcVar16 = local_58;
          phVar12 = local_80;
          CVar9 = CVar19;
          if (CVar8 == CURLE_OK) {
            pcVar20 = "1.1";
            if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar20 = "1.0";
            }
            if ((conn->host).name == local_58) {
              bVar22 = (bool)(((conn->bits).field_0x5 & 2) >> 1);
            }
            else {
              pcVar13 = strchr(local_58,0x3a);
              bVar22 = pcVar13 != (char *)0x0;
            }
            pcVar13 = "";
            if (bVar22 != false) {
              pcVar13 = "[";
            }
            pcVar17 = "";
            if (bVar22 != false) {
              pcVar17 = "]";
            }
            pcVar16 = curl_maprintf("%s%s%s:%d",pcVar13,pcVar16,pcVar17,(ulong)local_74);
            if (pcVar16 == (char *)0x0) {
              Curl_add_buffer_free(&req_buffer);
              CVar9 = CURLE_OUT_OF_MEMORY;
              bVar22 = false;
              CVar8 = CURLE_OK;
              phVar12 = local_80;
            }
            else {
              pcVar13 = Curl_checkProxyheaders(conn,"Host");
              local_98 = pcVar16;
              if (pcVar13 == (char *)0x0) {
                pcVar16 = curl_maprintf("Host: %s\r\n");
                phVar12 = local_80;
                if (pcVar16 == (char *)0x0) {
                  (*Curl_cfree)(local_98);
                  Curl_add_buffer_free(&req_buffer);
                  CVar9 = CURLE_OUT_OF_MEMORY;
                  bVar22 = false;
                  CVar8 = CURLE_OK;
                  goto LAB_001388b2;
                }
              }
              else {
                pcVar16 = (char *)0x0;
              }
              phVar12 = local_80;
              local_50 = pcVar20;
              pcVar20 = Curl_checkProxyheaders(conn,"Proxy-Connection");
              pcVar13 = "";
              if (pcVar20 == (char *)0x0) {
                pcVar13 = "Proxy-Connection: Keep-Alive\r\n";
              }
              pcVar17 = Curl_checkProxyheaders(conn,"User-Agent");
              pcVar20 = "";
              if ((pcVar17 == (char *)0x0) && (pcVar20 = "", (data->set).str[0x26] != (char *)0x0))
              {
                pcVar20 = (conn->allocptr).uagent;
              }
              pcVar17 = pcVar16;
              if (pcVar16 == (char *)0x0) {
                pcVar17 = "";
              }
              pcVar21 = (conn->allocptr).proxyuserpwd;
              if (pcVar21 == (char *)0x0) {
                pcVar21 = "";
              }
              CVar8 = Curl_add_bufferf(&req_buffer,"CONNECT %s HTTP/%s\r\n%s%s%s%s",local_98,
                                       local_50,pcVar17,pcVar21,pcVar20,pcVar13);
              if (pcVar16 != (char *)0x0) {
                (*Curl_cfree)(pcVar16);
              }
              (*Curl_cfree)(local_98);
              if (CVar8 == CURLE_OK) {
                CVar8 = Curl_add_custom_headers(conn,true,req_buffer);
              }
              if (CVar8 == CURLE_OK) {
                CVar8 = Curl_add_bufferf(&req_buffer,"\r\n");
              }
              if (CVar8 == CURLE_OK) {
                CVar8 = Curl_add_buffer_send(&req_buffer,conn,local_48,0,local_84);
              }
              req_buffer = (Curl_send_buffer *)0x0;
              bVar22 = true;
              if (CVar8 != CURLE_OK) {
                Curl_failf(data,"Failed sending CONNECT to proxy");
              }
            }
LAB_001388b2:
            if (bVar22) goto LAB_001388b6;
            bVar22 = false;
          }
          else {
LAB_001388b6:
            Curl_add_buffer_free(&req_buffer);
            if (CVar8 == CURLE_OK) {
              phVar12->tunnel_state = TUNNEL_CONNECT;
              phVar12->perline = 0;
              bVar22 = true;
            }
            else {
              bVar22 = false;
              CVar9 = CVar8;
            }
          }
        }
        iVar10 = 1;
        CVar19 = CVar9;
        if (bVar22) goto LAB_001388ff;
      }
      else {
LAB_001388ff:
        tVar14 = Curl_timeleft(data,(curltime *)0x0,true);
        if (tVar14 < 1) {
          Curl_failf(data,"Proxy CONNECT aborted due to timeout");
          CVar9 = CURLE_OPERATION_TIMEDOUT;
        }
        else {
          _Var7 = Curl_conn_data_pending(conn,local_84);
          if (_Var7) {
            iVar10 = phVar12->keepon;
            while (bVar22 = false, iVar10 != 0) {
              if (local_40 <= phVar12->ptr) {
                Curl_failf(data,"CONNECT response too large!");
                CVar9 = CURLE_RECV_ERROR;
                goto LAB_001390b5;
              }
              local_98._4_4_ = (undefined4)((ulong)local_98 >> 0x20);
              local_98 = (char *)CONCAT44(local_98._4_4_,CVar19);
              CVar9 = Curl_read(conn,local_68,phVar12->ptr,1,(ssize_t *)&req_buffer);
              lVar18 = 1;
              if ((CVar9 == CURLE_AGAIN) || (iVar10 = Curl_pgrsUpdate(conn), iVar10 != 0))
              goto LAB_00138994;
              CVar19 = (CURLcode)local_98;
              if (CVar9 != CURLE_OK) {
                phVar12->keepon = 0;
                bVar22 = false;
                break;
              }
              bVar22 = false;
              if ((long)req_buffer < 1) {
                if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
                  Curl_failf(data,"Proxy CONNECT aborted");
                  bVar22 = true;
                  phVar12->keepon = 0;
                }
                else {
                  puVar1 = &(conn->bits).field_0x6;
                  *puVar1 = *puVar1 | 0x80;
                  Curl_infof(data,"Proxy CONNECT connection closed\n");
                  phVar12->keepon = 0;
                }
                break;
              }
              if (phVar12->keepon < 2) {
                size = (long)phVar12->perline + 1;
                phVar12->perline = (int)size;
                if (*phVar12->ptr == '\n') {
                  if (((data->set).field_0x88b & 0x40) != 0) {
                    Curl_debug(data,CURLINFO_HEADER_IN,phVar12->line_start,size);
                  }
                  uVar4 = *(ulong *)&(data->set).field_0x888;
                  if (((uVar4 >> 0x31 & 1) == 0) &&
                     (CVar9 = Curl_client_write(conn,(((uint)uVar4 >> 0x19 & 1) != 0) + 2,
                                                phVar12->line_start,(long)phVar12->perline),
                     CVar9 != CURLE_OK)) goto LAB_00138994;
                  lVar15 = (long)phVar12->perline;
                  pcVar2 = &(data->info).header_size;
                  *pcVar2 = *pcVar2 + lVar15;
                  pcVar2 = &(data->req).headerbytecount;
                  *pcVar2 = *pcVar2 + lVar15;
                  cVar3 = *phVar12->line_start;
                  if ((cVar3 != '\r') && (cVar3 != '\n')) {
                    phVar12->line_start[lVar15] = '\0';
                    iVar10 = curl_strnequal("WWW-Authenticate:",phVar12->line_start,0x11);
                    if (((iVar10 == 0) || (*local_90 != 0x191)) &&
                       ((iVar10 = curl_strnequal("Proxy-authenticate:",phVar12->line_start,0x13),
                        iVar10 == 0 || (*local_90 != 0x197)))) {
                      iVar10 = curl_strnequal("Content-Length:",phVar12->line_start,0xf);
                      if (iVar10 == 0) {
                        _Var7 = Curl_compareheader(phVar12->line_start,"Connection:","close");
                        if (_Var7) {
LAB_00138e34:
                          phVar12->field_0x4024 = phVar12->field_0x4024 | 2;
                        }
                        else {
                          iVar10 = curl_strnequal("Transfer-Encoding:",phVar12->line_start,0x12);
                          if (iVar10 == 0) {
                            _Var7 = Curl_compareheader(phVar12->line_start,"Proxy-Connection:",
                                                       "close");
                            if (_Var7) goto LAB_00138e34;
                            iVar10 = __isoc99_sscanf(phVar12->line_start,"HTTP/1.%d %d",&subversion,
                                                     local_90);
                            if (iVar10 == 2) {
                              (data->info).httpproxycode = (data->req).httpcode;
                            }
                          }
                          else {
                            if (*local_90 - 200U < 100) {
                              pcVar16 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                              goto LAB_00138da8;
                            }
                            _Var7 = Curl_compareheader(phVar12->line_start,"Transfer-Encoding:",
                                                       "chunked");
                            if (_Var7) {
                              Curl_infof(data,"CONNECT responded chunked\n");
                              phVar12->field_0x4024 = phVar12->field_0x4024 | 1;
                              Curl_httpchunk_init(conn);
                            }
                          }
                        }
                      }
                      else if (*local_90 - 200U < 100) {
                        pcVar16 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_00138da8:
                        Curl_infof(data,pcVar16);
                      }
                      else {
                        curlx_strtoofft(phVar12->line_start + 0xf,(char **)0x0,10,local_70);
                      }
                    }
                    else {
                      local_98 = (char *)CONCAT44(local_98._4_4_,*local_90);
                      pcVar16 = Curl_copy_header_value(phVar12->line_start);
                      if (pcVar16 == (char *)0x0) {
                        bVar22 = false;
                      }
                      else {
                        CVar9 = Curl_http_input_auth(conn,(CURLcode)local_98 == 0x197,pcVar16);
                        local_98 = (char *)CONCAT44(local_98._4_4_,CVar9);
                        (*Curl_cfree)(pcVar16);
                        bVar22 = (CURLcode)local_98 == 0;
                      }
                      if (!bVar22) goto LAB_00138994;
                    }
                    phVar12->perline = 0;
                    phVar12->ptr = phVar12->connect_buffer;
                    phVar12->line_start = phVar12->connect_buffer;
                    lVar18 = 0;
                    goto LAB_00138994;
                  }
                  phVar12->ptr = phVar12->connect_buffer;
                  if ((*local_90 == 0x197) && (((data->state).field_0x4e4 & 0x20) == 0)) {
                    phVar12->keepon = 2;
                    if (phVar12->cl == 0) {
                      if ((phVar12->field_0x4024 & 1) == 0) goto LAB_00138dd6;
                      Curl_infof(data,"Ignore chunked response-body\n");
                      puVar1 = &(data->req).field_0x570;
                      *puVar1 = *puVar1 | 8;
                      if (phVar12->line_start[1] == '\n') {
                        phVar12->line_start = phVar12->line_start + 1;
                      }
                      CVar11 = Curl_httpchunk_read(conn,phVar12->line_start + 1,1,
                                                   (ssize_t *)&req_buffer);
                      if (CVar11 == CHUNKE_STOP) {
                        Curl_infof(data,"chunk reading DONE\n");
                        phVar12->keepon = 0;
                        phVar12->tunnel_state = TUNNEL_COMPLETE;
                      }
                    }
                    else {
                      Curl_infof(data,"Ignore %ld bytes of response-body\n");
                    }
                  }
                  else {
LAB_00138dd6:
                    phVar12->keepon = 0;
                  }
                  lVar18 = 4;
                  if (*local_70 != 0) {
LAB_00138994:
                    CVar9 = (*(code *)(&DAT_00155fa4 + *(int *)(&DAT_00155fa4 + lVar18 * 4)))();
                    return CVar9;
                  }
                  phVar12->tunnel_state = TUNNEL_COMPLETE;
                }
                else {
                  phVar12->ptr = phVar12->ptr + 1;
                }
              }
              else {
                phVar12->ptr = phVar12->connect_buffer;
                lVar15 = phVar12->cl;
                if (lVar15 != 0) {
                  *local_70 = lVar15 + -1;
                  lVar18 = 4;
                  if (1 < lVar15) goto LAB_00138994;
                  phVar12->keepon = 0;
                  phVar12->tunnel_state = TUNNEL_COMPLETE;
                  break;
                }
                local_38 = 0;
                CVar11 = Curl_httpchunk_read(conn,phVar12->connect_buffer,1,&local_38);
                if (CVar11 == CHUNKE_STOP) {
                  Curl_infof(data,"chunk reading DONE\n");
                  phVar12->keepon = 0;
                  phVar12->tunnel_state = TUNNEL_COMPLETE;
                }
              }
              iVar10 = phVar12->keepon;
            }
            iVar10 = Curl_pgrsUpdate(conn);
            CVar9 = CURLE_RECV_ERROR;
            if (iVar10 != 0) {
              CVar9 = CURLE_ABORTED_BY_CALLBACK;
            }
            if (iVar10 != 0 || bVar22) {
LAB_001390b5:
              iVar10 = 1;
            }
            else {
              if (99 < (data->info).httpproxycode - 200U) {
                CVar9 = Curl_http_auth_act(conn);
                iVar10 = 1;
                if (CVar9 != CURLE_OK) goto LAB_001390b9;
                if (((conn->bits).field_0x4 & 1) != 0) {
                  phVar12->field_0x4024 = phVar12->field_0x4024 | 2;
                }
              }
              lVar18 = local_60;
              iVar10 = 0;
              CVar9 = CVar19;
              if (((phVar12->field_0x4024 & 2) != 0) &&
                 (iVar10 = 0, (data->req).newurl != (char *)0x0)) {
                Curl_closesocket(conn,conn->sock[local_60]);
                conn->sock[lVar18] = -1;
                iVar10 = 2;
              }
            }
LAB_001390b9:
            if (iVar10 == 0) {
              iVar10 = 0;
              if (((data->req).newurl != (char *)0x0) &&
                 (iVar10 = 0, phVar12->tunnel_state == TUNNEL_COMPLETE)) {
                phVar5 = conn->connect_state;
                phVar5->tunnel_state = TUNNEL_INIT;
                phVar5->keepon = 1;
                phVar5->line_start = phVar5->connect_buffer;
                phVar5->ptr = phVar5->connect_buffer;
                phVar5->cl = 0;
                phVar5->field_0x4024 = phVar5->field_0x4024 & 0xfd;
              }
            }
            goto LAB_001390bd;
          }
          CVar9 = CURLE_OK;
        }
        iVar10 = 1;
      }
LAB_001390bd:
      if (iVar10 != 0) {
        if (iVar10 != 2) goto LAB_0013926d;
        break;
      }
      CVar19 = CVar9;
    } while ((data->req).newurl != (char *)0x0);
    if ((data->info).httpproxycode - 200U < 100) {
      phVar12->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      puVar1 = &(data->state).authproxy.field_0x18;
      *puVar1 = *puVar1 | 1;
      CVar9 = CURLE_OK;
      Curl_infof(data,"Proxy replied %d to CONNECT request\n",
                 (ulong)(uint)(data->info).httpproxycode);
      puVar1 = &(data->req).field_0x570;
      *puVar1 = *puVar1 & 0xf7;
      puVar1 = &(conn->bits).field_0x6;
      *puVar1 = *puVar1 & 0xfe;
    }
    else {
      if (((phVar12->field_0x4024 & 2) == 0) || ((data->req).newurl == (char *)0x0)) {
        (*Curl_cfree)((data->req).newurl);
        (data->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        lVar18 = local_60;
        Curl_closesocket(conn,conn->sock[local_60]);
        conn->sock[lVar18] = -1;
      }
      else {
        puVar1 = &(conn->bits).field_0x6;
        *puVar1 = *puVar1 | 0x80;
        Curl_infof(data,"Connect me again please\n");
        conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
        Curl_infof(conn->data,"CONNECT phase completed!\n");
      }
      phVar12->tunnel_state = TUNNEL_INIT;
      CVar9 = CURLE_OK;
      if (((conn->bits).field_0x6 & 0x80) == 0) {
        Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(data->req).httpcode);
        CVar9 = CURLE_RECV_ERROR;
      }
    }
  }
LAB_0013926d:
  if (((CVar9 != CURLE_OK) || (conn->connect_state == (http_connect_state *)0x0)) ||
     (conn->connect_state->tunnel_state == TUNNEL_COMPLETE)) {
    conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
    Curl_infof(conn->data,"CONNECT phase completed!\n");
  }
  return CVar9;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}